

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_timer.cpp
# Opt level: O0

double I_GetTimeFrac(uint32 *ms)

{
  int iVar1;
  DWORD now;
  uint32 *ms_local;
  
  iVar1 = SDL_GetTicks();
  if (ms != (uint32 *)0x0) {
    *ms = TicStart + 0x1c;
  }
  if (TicStart == 0) {
    ms_local = (uint32 *)0x3ff0000000000000;
  }
  else {
    ms_local = (uint32 *)clamp<double>((double)((iVar1 - TicStart) * 0x23) / 1000.0,0.0,1.0);
  }
  return (double)ms_local;
}

Assistant:

double I_GetTimeFrac (uint32 *ms)
{
	DWORD now = SDL_GetTicks ();
	if (ms) *ms = TicStart + (1000 / TICRATE);
	if (TicStart == 0)
	{
		return 1;
	}
	else
	{
		return clamp<double>((now - TicStart) * TICRATE / 1000., 0, 1);
	}
}